

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uras.c
# Opt level: O3

void concat(char *s1,char *s2,char *s3)

{
  char cVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  string t;
  char local_58 [88];
  
  sVar3 = 0xffffffffffffffff;
  do {
    cVar1 = s1[sVar3 + 1];
    local_58[sVar3 + 1] = cVar1;
    sVar3 = sVar3 + 1;
  } while (cVar1 != '\0');
  sVar2 = sVar3;
  do {
    sVar4 = sVar2;
    cVar1 = s2[sVar4 - (long)(int)sVar3];
    local_58[sVar4] = cVar1;
    sVar2 = sVar4 + 1;
  } while (cVar1 != '\0');
  local_58[sVar4] = '\0';
  memcpy(s3,local_58,sVar4 + 1);
  return;
}

Assistant:

void concat(s1,s2,s3)
string s1, s2, s3 ;

{ string t ;
  int i, j ;

  for (i = 0 ; (t[i] = s1[i]) != '\0' ; i++) ;
  for (j = i ; (t[j] = s2[j - i]) != '\0' ; j++) ;
  t[j] = '\0' ;
  for (i = 0 ; i <= j ; i++) {
    s3[i] = t[i] ;
  }
}